

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::subIf(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *nodes;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  undefined8 *puVar5;
  AST *pAVar6;
  RefAST RVar7;
  NoViableAltException *pNVar8;
  AST *pAVar9;
  RefAST tmp180_AST;
  RefAST tmp181_AST;
  RefAST tmp178_AST;
  RefAST subIf_AST;
  RefAST tmp179_AST;
  RefAST C3k_AST;
  RefAST C2_AST;
  RefAST C1_AST;
  RefAST C1k_AST;
  RefAST C3x_AST;
  RefAST C3_AST;
  RefAST C2x_AST;
  RefAST C1x_AST;
  RefAST E_AST;
  ASTPair currentAST;
  RefToken C3k;
  RefToken C1k;
  undefined1 local_160 [16];
  ASTFactory local_150;
  undefined1 local_140 [16];
  RefCount<AST> local_130;
  RefCount<AST> local_128;
  RefCount<AST> local_120;
  RefCount<AST> local_118;
  RefCount<AST> local_110;
  RefCount<AST> local_108;
  RefCount<AST> local_100;
  RefCount<AST> local_f8;
  RefCount<AST> local_f0;
  ASTPair local_e8;
  ASTFactory local_d0;
  RefCount<Token> local_c0;
  RefCount<Token> local_b8;
  RefCount<Token> local_b0;
  RefCount<Token> local_a8;
  RefCount<Token> local_a0;
  RefCount<AST> local_98;
  RefCount<AST> local_90;
  RefCount<AST> local_88;
  RefToken local_80;
  RefToken local_78;
  RefCount<AST> local_70;
  RefCount<AST> local_68;
  RefCount<Token> local_60;
  RefToken local_58;
  RefCount<AST> local_50;
  RefCount<AST> local_48;
  RefCount<AST> local_40;
  RefCount<Token> local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_130.ref = nullAST.ref;
  local_e8.root.ref = (Ref *)0x0;
  local_e8.child.ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_150.nodeFactory = (factory_type)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
    local_150.nodeFactory = (factory_type)local_130.ref;
  }
  local_a8.ref = nullToken.ref;
  if (nullToken.ref == (Ref *)0x0) {
    local_a0.ref = (Ref *)0x0;
  }
  else {
    (nullToken.ref)->count = (nullToken.ref)->count + 1;
    local_a0.ref = local_a8.ref;
  }
  if (local_130.ref == (Ref *)0x0) {
    local_128.ref = (Ref *)0x0;
  }
  else {
    uVar3 = (local_130.ref)->count;
    (local_130.ref)->count = uVar3 + 1;
    (local_130.ref)->count = uVar3 + 2;
    uVar3 = (local_130.ref)->count;
    (local_130.ref)->count = uVar3 + 1;
    (local_130.ref)->count = uVar3 + 2;
    uVar3 = (local_130.ref)->count;
    (local_130.ref)->count = uVar3 + 1;
    (local_130.ref)->count = uVar3 + 2;
    (local_130.ref)->count = (local_130.ref)->count + 1;
    local_128.ref = local_130.ref;
  }
  if (local_a8.ref == (Ref *)0x0) {
    local_a8.ref = (Ref *)0x0;
  }
  else {
    (local_a8.ref)->count = (local_a8.ref)->count + 1;
  }
  if (local_130.ref == (Ref *)0x0) {
    local_130.ref = (Ref *)0x0;
  }
  else {
    uVar3 = (local_130.ref)->count;
    (local_130.ref)->count = uVar3 + 1;
    (local_130.ref)->count = uVar3 + 2;
  }
  local_120.ref = local_128.ref;
  local_118.ref = local_128.ref;
  local_110.ref = local_130.ref;
  local_108.ref = local_128.ref;
  local_100.ref = local_128.ref;
  local_f8.ref = local_128.ref;
  local_f0.ref = local_128.ref;
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_150,this,1);
  RefCount<Token>::operator=(&local_a0,(RefCount<Token> *)&local_150);
  RefCount<Token>::~RefCount((RefCount<Token> *)&local_150);
  nodes = &(this->super_LLkParser).super_Parser.astFactory;
  if (local_a0.ref == (Ref *)0x0) {
    local_38.ref = (Ref *)0x0;
  }
  else {
    (local_a0.ref)->count = (local_a0.ref)->count + 1;
    local_38.ref = local_a0.ref;
  }
  ASTFactory::create(&local_150,(RefToken *)nodes);
  RefCount<AST>::operator=(&local_118,(RefCount<AST> *)&local_150);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_150);
  RefCount<Token>::~RefCount(&local_38);
  Parser::match((Parser *)this,0x28);
  local_150._vptr_ASTFactory = (_func_int **)nullAST;
  if (nullAST.ref == (Ref *)0x0) {
    local_150._vptr_ASTFactory = (_func_int **)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_b0,this,1);
  ASTFactory::create((ASTFactory *)(local_140 + 8),(RefToken *)nodes);
  RefCount<AST>::operator=((RefCount<AST> *)&local_150,(RefCount<AST> *)(local_140 + 8));
  RefCount<AST>::~RefCount((RefCount<AST> *)(local_140 + 8));
  RefCount<Token>::~RefCount(&local_b0);
  Parser::match((Parser *)this,6);
  expr(this);
  RefCount<AST>::operator=(&local_f0,this_00);
  local_140._8_8_ = nullAST;
  if (nullAST.ref == (Ref *)0x0) {
    local_140._8_8_ = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_b8,this,1);
  ASTFactory::create((ASTFactory *)local_160,(RefToken *)nodes);
  RefCount<AST>::operator=((RefCount<AST> *)(local_140 + 8),(RefCount<AST> *)local_160);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_160);
  RefCount<Token>::~RefCount(&local_b8);
  Parser::match((Parser *)this,7);
  subEntryList(this);
  RefCount<AST>::operator=(&local_f8,this_00);
  piVar4 = (int *)operator_new(0x20);
  *piVar4 = 0;
  piVar4[2] = 0;
  piVar4[3] = 0;
  piVar4[4] = 0;
  piVar4[5] = 0;
  piVar4[6] = 0;
  piVar4[7] = 0;
  puVar5 = (undefined8 *)operator_new(0x18);
  *(undefined8 **)(piVar4 + 2) = puVar5;
  *(undefined8 **)(piVar4 + 4) = puVar5;
  *(undefined8 **)(piVar4 + 6) = puVar5 + 3;
  *puVar5 = 0;
  puVar5[1] = 0;
  puVar5[2] = 0;
  *(undefined8 **)(piVar4 + 4) = puVar5 + 3;
  if (local_118.ref == (Ref *)0x0) {
    local_40.ref = (Ref *)0x0;
  }
  else {
    (local_118.ref)->count = (local_118.ref)->count + 1;
    local_40.ref = local_118.ref;
  }
  iVar2 = *piVar4;
  *piVar4 = iVar2 + 1;
  RefCount<AST>::operator=((RefCount<AST> *)(puVar5 + iVar2),&local_40);
  if (local_f0.ref == (Ref *)0x0) {
    local_48.ref = (Ref *)0x0;
  }
  else {
    (local_f0.ref)->count = (local_f0.ref)->count + 1;
    local_48.ref = local_f0.ref;
  }
  iVar2 = *piVar4;
  *piVar4 = iVar2 + 1;
  RefCount<AST>::operator=((RefCount<AST> *)((long)iVar2 * 8 + *(long *)(piVar4 + 2)),&local_48);
  if (local_f8.ref == (Ref *)0x0) {
    local_50.ref = (Ref *)0x0;
  }
  else {
    (local_f8.ref)->count = (local_f8.ref)->count + 1;
    local_50.ref = local_f8.ref;
  }
  iVar2 = *piVar4;
  *piVar4 = iVar2 + 1;
  RefCount<AST>::operator=((RefCount<AST> *)((long)iVar2 * 8 + *(long *)(piVar4 + 2)),&local_50);
  ASTFactory::make((ASTFactory *)local_160,(ASTArray *)nodes);
  RefCount<AST>::operator=(&local_120,(RefCount<AST> *)local_160);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_160);
  RefCount<AST>::~RefCount(&local_50);
  RefCount<AST>::~RefCount(&local_48);
  RefCount<AST>::~RefCount(&local_40);
  iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if ((iVar2 < 0x29) ||
     (iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1), 0x2c < iVar2)) {
LAB_001a4808:
    iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if ((iVar2 != 0x29) &&
       (iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1), iVar2 != 0x2a)) {
LAB_001a4e88:
      pNVar8 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_58,this,1);
      NoViableAltException::NoViableAltException(pNVar8,&local_58);
      __cxa_throw(pNVar8,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    bVar1 = BitSet::member(&_tokenSet_48,iVar2);
    if (!bVar1) goto LAB_001a4e88;
    iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
    bVar1 = BitSet::member(&_tokenSet_4,iVar2);
    if (!bVar1) goto LAB_001a4e88;
  }
  else {
    iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    bVar1 = BitSet::member(&_tokenSet_48,iVar2);
    if (!bVar1) goto LAB_001a4808;
    iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
    bVar1 = BitSet::member(&_tokenSet_4,iVar2);
    if (!bVar1) goto LAB_001a4808;
    subElseIfList(this);
    RefCount<AST>::operator=(&local_100,this_00);
    RefCount<AST>::operator=(&local_128,&local_100);
  }
  iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar2 != 0x2a) {
    if (iVar2 != 0x29) {
      pNVar8 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_78,this,1);
      NoViableAltException::NoViableAltException(pNVar8,&local_78);
      __cxa_throw(pNVar8,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(local_160,this,1);
    RefCount<Token>::operator=(&local_a8,(RefCount<Token> *)local_160);
    RefCount<Token>::~RefCount((RefCount<Token> *)local_160);
    if (local_a8.ref == (Ref *)0x0) {
      local_60.ref = (Ref *)0x0;
    }
    else {
      (local_a8.ref)->count = (local_a8.ref)->count + 1;
      local_60.ref = local_a8.ref;
    }
    ASTFactory::create((ASTFactory *)local_160,(RefToken *)nodes);
    RefCount<AST>::operator=(&local_130,(RefCount<AST> *)local_160);
    RefCount<AST>::~RefCount((RefCount<AST> *)local_160);
    RefCount<Token>::~RefCount(&local_60);
    Parser::match((Parser *)this,0x29);
    subEntryList(this);
    RefCount<AST>::operator=(&local_110,this_00);
    piVar4 = (int *)operator_new(0x20);
    *piVar4 = 0;
    piVar4[2] = 0;
    piVar4[3] = 0;
    piVar4[4] = 0;
    piVar4[5] = 0;
    piVar4[6] = 0;
    piVar4[7] = 0;
    puVar5 = (undefined8 *)operator_new(0x10);
    *(undefined8 **)(piVar4 + 2) = puVar5;
    *(undefined8 **)(piVar4 + 4) = puVar5;
    *(undefined8 **)(piVar4 + 6) = puVar5 + 2;
    *puVar5 = 0;
    puVar5[1] = 0;
    *(undefined8 **)(piVar4 + 4) = puVar5 + 2;
    if (local_130.ref == (Ref *)0x0) {
      local_68.ref = (Ref *)0x0;
    }
    else {
      (local_130.ref)->count = (local_130.ref)->count + 1;
      local_68.ref = local_130.ref;
    }
    iVar2 = *piVar4;
    *piVar4 = iVar2 + 1;
    RefCount<AST>::operator=((RefCount<AST> *)(puVar5 + iVar2),&local_68);
    if (local_110.ref == (Ref *)0x0) {
      local_70.ref = (Ref *)0x0;
    }
    else {
      (local_110.ref)->count = (local_110.ref)->count + 1;
      local_70.ref = local_110.ref;
    }
    iVar2 = *piVar4;
    *piVar4 = iVar2 + 1;
    RefCount<AST>::operator=((RefCount<AST> *)((long)iVar2 * 8 + *(long *)(piVar4 + 2)),&local_70);
    ASTFactory::make((ASTFactory *)local_160,(ASTArray *)nodes);
    RefCount<AST>::operator=(&local_108,(RefCount<AST> *)local_160);
    RefCount<AST>::~RefCount((RefCount<AST> *)local_160);
    RefCount<AST>::~RefCount(&local_70);
    RefCount<AST>::~RefCount(&local_68);
  }
  local_160._0_8_ = nullAST.ref;
  if (nullAST.ref == (Ref *)0x0) {
    local_160._0_8_ = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_c0,this,1);
  ASTFactory::create((ASTFactory *)(local_160 + 8),(RefToken *)nodes);
  RefCount<AST>::operator=((RefCount<AST> *)local_160,(RefCount<AST> *)(local_160 + 8));
  RefCount<AST>::~RefCount((RefCount<AST> *)(local_160 + 8));
  RefCount<Token>::~RefCount(&local_c0);
  Parser::match((Parser *)this,0x2a);
  uVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  RVar7 = nullAST;
  if (0x35 < uVar3) {
LAB_001a4f2b:
    pNVar8 = (NoViableAltException *)__cxa_allocate_exception(0x40);
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
    NoViableAltException::NoViableAltException(pNVar8,&local_80);
    __cxa_throw(pNVar8,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  }
  if ((0x2d1fc0fc00e640U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
    if ((ulong)uVar3 != 8) goto LAB_001a4f2b;
    if (nullAST.ref == (Ref *)0x0) {
      RVar7.ref = (Ref *)0x0;
    }
    else {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    local_160._8_8_ = RVar7.ref;
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_d0.nodeFactory,this,1);
    ASTFactory::create((ASTFactory *)local_140,(RefToken *)nodes);
    RefCount<AST>::operator=((RefCount<AST> *)(local_160 + 8),(RefCount<AST> *)local_140);
    RefCount<AST>::~RefCount((RefCount<AST> *)local_140);
    RefCount<Token>::~RefCount((RefCount<Token> *)&local_d0.nodeFactory);
    Parser::match((Parser *)this,8);
    RefCount<AST>::~RefCount((RefCount<AST> *)(local_160 + 8));
  }
  RefCount<AST>::operator=((RefCount<AST> *)&local_150.nodeFactory,&local_e8.root);
  piVar4 = (int *)operator_new(0x20);
  *piVar4 = 0;
  piVar4[2] = 0;
  piVar4[3] = 0;
  piVar4[4] = 0;
  piVar4[5] = 0;
  piVar4[6] = 0;
  piVar4[7] = 0;
  puVar5 = (undefined8 *)operator_new(0x20);
  *(undefined8 **)(piVar4 + 2) = puVar5;
  *(undefined8 **)(piVar4 + 4) = puVar5;
  *(undefined8 **)(piVar4 + 6) = puVar5 + 4;
  puVar5[2] = 0;
  puVar5[3] = 0;
  *puVar5 = 0;
  puVar5[1] = 0;
  *(undefined8 **)(piVar4 + 4) = puVar5 + 4;
  ASTFactory::create(&local_d0,(int)nodes);
  iVar2 = *piVar4;
  *piVar4 = iVar2 + 1;
  RefCount<AST>::operator=
            ((RefCount<AST> *)((long)iVar2 * 8 + *(long *)(piVar4 + 2)),(RefCount<AST> *)&local_d0);
  if (local_120.ref == (Ref *)0x0) {
    local_88.ref = (Ref *)0x0;
  }
  else {
    (local_120.ref)->count = (local_120.ref)->count + 1;
    local_88.ref = local_120.ref;
  }
  iVar2 = *piVar4;
  *piVar4 = iVar2 + 1;
  RefCount<AST>::operator=((RefCount<AST> *)((long)iVar2 * 8 + *(long *)(piVar4 + 2)),&local_88);
  if (local_128.ref == (Ref *)0x0) {
    local_90.ref = (Ref *)0x0;
  }
  else {
    (local_128.ref)->count = (local_128.ref)->count + 1;
    local_90.ref = local_128.ref;
  }
  iVar2 = *piVar4;
  *piVar4 = iVar2 + 1;
  RefCount<AST>::operator=((RefCount<AST> *)((long)iVar2 * 8 + *(long *)(piVar4 + 2)),&local_90);
  if (local_108.ref == (Ref *)0x0) {
    local_98.ref = (Ref *)0x0;
  }
  else {
    (local_108.ref)->count = (local_108.ref)->count + 1;
    local_98.ref = local_108.ref;
  }
  iVar2 = *piVar4;
  *piVar4 = iVar2 + 1;
  RefCount<AST>::operator=((RefCount<AST> *)((long)iVar2 * 8 + *(long *)(piVar4 + 2)),&local_98);
  ASTFactory::make((ASTFactory *)(local_160 + 8),(ASTArray *)nodes);
  RefCount<AST>::operator=((RefCount<AST> *)&local_150.nodeFactory,(RefCount<AST> *)(local_160 + 8))
  ;
  RefCount<AST>::~RefCount((RefCount<AST> *)(local_160 + 8));
  RefCount<AST>::~RefCount(&local_98);
  RefCount<AST>::~RefCount(&local_90);
  RefCount<AST>::~RefCount(&local_88);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_d0);
  RefCount<AST>::operator=(&local_e8.root,(RefCount<AST> *)&local_150.nodeFactory);
  if ((Ref *)local_150.nodeFactory == (Ref *)0x0) {
    pAVar6 = (AST *)0x0;
  }
  else {
    pAVar6 = *(AST **)local_150.nodeFactory;
  }
  if (nullAST.ref == (Ref *)0x0) {
    pAVar9 = (AST *)0x0;
  }
  else {
    pAVar9 = (nullAST.ref)->ptr;
  }
  bVar1 = pAVar6 != pAVar9;
  if (bVar1) {
    AST::getFirstChild(*(AST **)local_150.nodeFactory);
    if ((Ref *)local_140._0_8_ == (Ref *)0x0) {
      pAVar6 = (AST *)0x0;
    }
    else {
      pAVar6 = *(AST **)local_140._0_8_;
    }
    if (nullAST.ref == (Ref *)0x0) {
      pAVar9 = (AST *)0x0;
    }
    else {
      pAVar9 = (nullAST.ref)->ptr;
    }
    if (pAVar6 != pAVar9) {
      bVar1 = true;
      AST::getFirstChild(*(AST **)local_150.nodeFactory);
      goto LAB_001a4cf0;
    }
  }
  if ((Ref *)local_150.nodeFactory == (Ref *)0x0) {
    local_160._8_8_ = (Ref *)0x0;
  }
  else {
    *(uint *)((long)local_150.nodeFactory + 8) = *(uint *)((long)local_150.nodeFactory + 8) + 1;
    local_160._8_8_ = local_150.nodeFactory;
  }
LAB_001a4cf0:
  RefCount<AST>::operator=(&local_e8.child,(RefCount<AST> *)(local_160 + 8));
  RefCount<AST>::~RefCount((RefCount<AST> *)(local_160 + 8));
  if (bVar1) {
    RefCount<AST>::~RefCount((RefCount<AST> *)local_140);
  }
  ASTPair::advanceChildToEnd(&local_e8);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_160);
  RefCount<AST>::~RefCount((RefCount<AST> *)(local_140 + 8));
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_150);
  RefCount<AST>::operator=(this_00,(RefCount<AST> *)&local_150.nodeFactory);
  RefCount<AST>::~RefCount(&local_110);
  RefCount<AST>::~RefCount(&local_130);
  RefCount<Token>::~RefCount(&local_a8);
  RefCount<AST>::~RefCount(&local_108);
  RefCount<AST>::~RefCount(&local_100);
  RefCount<AST>::~RefCount(&local_128);
  RefCount<AST>::~RefCount(&local_f8);
  RefCount<AST>::~RefCount(&local_120);
  RefCount<AST>::~RefCount(&local_f0);
  RefCount<AST>::~RefCount(&local_118);
  RefCount<Token>::~RefCount(&local_a0);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_150.nodeFactory);
  RefCount<AST>::~RefCount(&local_e8.child);
  RefCount<AST>::~RefCount(&local_e8.root);
  return;
}

Assistant:

void GrpParser::subIf() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST subIf_AST = nullAST;
	RefToken  C1k = nullToken;
	RefAST C1k_AST = nullAST;
	RefAST E_AST = nullAST;
	RefAST C1_AST = nullAST;
	RefAST C1x_AST = nullAST;
	RefAST C2_AST = nullAST;
	RefAST C2x_AST = nullAST;
	RefAST C3_AST = nullAST;
	RefToken  C3k = nullToken;
	RefAST C3k_AST = nullAST;
	RefAST C3x_AST = nullAST;
	
	try {      // for error handling
		C1k = LT(1);
		C1k_AST = astFactory.create(C1k);
		match(LITERAL_if);
		RefAST tmp178_AST = nullAST;
		tmp178_AST = astFactory.create(LT(1));
		match(OP_LPAREN);
		expr();
		E_AST = returnAST;
		RefAST tmp179_AST = nullAST;
		tmp179_AST = astFactory.create(LT(1));
		match(OP_RPAREN);
		{
		subEntryList();
		C1x_AST = returnAST;
		C1_AST = astFactory.make( (new ASTArray(3))->add(C1k_AST)->add(E_AST)->add(C1x_AST));
		}
		{
		if (((LA(1) >= LITERAL_else && LA(1) <= LITERAL_elseif)) && (_tokenSet_48.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
			subElseIfList();
			C2x_AST = returnAST;
			C2_AST = C2x_AST;
		}
		else if ((LA(1)==LITERAL_else||LA(1)==LITERAL_endif) && (_tokenSet_48.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		{
		switch ( LA(1)) {
		case LITERAL_else:
		{
			C3k = LT(1);
			C3k_AST = astFactory.create(C3k);
			match(LITERAL_else);
			subEntryList();
			C3x_AST = returnAST;
			C3_AST = astFactory.make( (new ASTArray(2))->add(C3k_AST)->add(C3x_AST));
			break;
		}
		case LITERAL_endif:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		RefAST tmp180_AST = nullAST;
		tmp180_AST = astFactory.create(LT(1));
		match(LITERAL_endif);
		{
		switch ( LA(1)) {
		case OP_SEMI:
		{
			RefAST tmp181_AST = nullAST;
			tmp181_AST = astFactory.create(LT(1));
			match(OP_SEMI);
			break;
		}
		case OP_LPAREN:
		case LITERAL_environment:
		case LITERAL_endenvironment:
		case IDENT:
		case LITERAL_table:
		case LITERAL_endtable:
		case LITERAL_pseudo:
		case LIT_UHEX:
		case LITERAL_codepoint:
		case LITERAL_glyphid:
		case LITERAL_postscript:
		case LITERAL_unicode:
		case LITERAL_pass:
		case LITERAL_endpass:
		case LITERAL_if:
		case LITERAL_else:
		case LITERAL_endif:
		case Zelseif:
		case LITERAL_elseif:
		case OP_LBRACKET:
		case OP_UNDER:
		case OP_AT:
		case OP_HASH:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		subIf_AST = currentAST.root;
		subIf_AST = astFactory.make( (new ASTArray(4))->add(astFactory.create(ZifStruct))->add(C1_AST)->add(C2_AST)->add(C3_AST));
		currentAST.root = subIf_AST;
		currentAST.child = subIf_AST!=nullAST &&subIf_AST->getFirstChild()!=nullAST ?
			subIf_AST->getFirstChild() : subIf_AST;
		currentAST.advanceChildToEnd();
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_47);
	}
	returnAST = subIf_AST;
}